

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O2

InversionType * __thiscall
OpenMD::ForceField::getInversionType
          (ForceField *this,string *at1,string *at2,string *at3,string *at4)

{
  AtomTypeContainer *this_00;
  ElemPtr pIVar1;
  ElemPtr this_01;
  ElemPtr this_02;
  ElemPtr this_03;
  ElemPtr this_04;
  pointer ppAVar2;
  pointer ppAVar3;
  pointer ppAVar4;
  int iVar5;
  pointer ppAVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  foundInversions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at4Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at3Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at2Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at1Chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at4key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at3key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at2key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at1key;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  string local_190;
  TypeContainer<OpenMD::InversionType,_4> *local_170;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_168;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  _Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_108;
  _Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_f0;
  _Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_d8;
  _Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_128,at1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_128,at2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_128,at3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_128,at4);
  local_170 = &this->inversionTypeCont_;
  pIVar1 = TypeContainer<OpenMD::InversionType,_4>::permutedFindSkippingFirstElement
                     (local_170,&local_128);
  if (pIVar1 != (ElemPtr)0x0) goto LAB_00152472;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_48,at1);
  this_00 = &this->atomTypeCont_;
  this_01 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_48);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,at2);
  this_02 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_68);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_88,at3);
  this_03 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_88);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a8,at4);
  this_04 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_a8);
  AtomType::allYourBase
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_c0,this_01);
  AtomType::allYourBase
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_d8,this_02);
  AtomType::allYourBase
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_f0,this_03);
  AtomType::allYourBase
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_108,this_04);
  local_168.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a4 = 0;
  for (ppAVar2 = local_d8._M_impl.super__Vector_impl_data._M_start;
      ppAVar2 != local_d8._M_impl.super__Vector_impl_data._M_finish; ppAVar2 = ppAVar2 + 1) {
    local_1ac = local_1a4;
    for (ppAVar3 = local_f0._M_impl.super__Vector_impl_data._M_start;
        ppAVar3 != local_f0._M_impl.super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
      local_1a8 = 0;
      for (ppAVar4 = local_c0._M_impl.super__Vector_impl_data._M_start;
          ppAVar6 = local_108._M_impl.super__Vector_impl_data._M_start, iVar5 = local_1ac,
          ppAVar4 != local_c0._M_impl.super__Vector_impl_data._M_finish; ppAVar4 = ppAVar4 + 1) {
        for (; ppAVar6 != local_108._M_impl.super__Vector_impl_data._M_finish; ppAVar6 = ppAVar6 + 1
            ) {
          local_148 = 0;
          uStack_140 = 0;
          local_138 = 0;
          AtomType::getName_abi_cxx11_(&local_190,*ppAVar4);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          AtomType::getName_abi_cxx11_(&local_190,*ppAVar2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          AtomType::getName_abi_cxx11_(&local_190,*ppAVar3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          AtomType::getName_abi_cxx11_(&local_190,*ppAVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          pIVar1 = TypeContainer<OpenMD::InversionType,_4>::permutedFindSkippingFirstElement
                             (local_170,(KeyType *)&local_148);
          if (pIVar1 != (ElemPtr)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_190,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_148);
            local_190.field_2._12_4_ = local_1a8;
            local_190.field_2._8_4_ = iVar5;
            std::
            vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ::
            emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                        *)&local_168,
                       (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_190);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_190);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_148);
          iVar5 = iVar5 + 1;
        }
        local_1a8 = local_1a8 + 1;
      }
      local_1ac = local_1ac + 1;
    }
    local_1a4 = local_1a4 + 1;
  }
  if (local_168.
      super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_168.
      super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (ppAVar3 = local_d8._M_impl.super__Vector_impl_data._M_start; ppAVar3 != ppAVar2;
        ppAVar3 = ppAVar3 + 1) {
      local_1ac = local_1a4;
      for (ppAVar2 = local_f0._M_impl.super__Vector_impl_data._M_start;
          ppAVar2 != local_f0._M_impl.super__Vector_impl_data._M_finish; ppAVar2 = ppAVar2 + 1) {
        local_1a8 = 0;
        for (ppAVar4 = local_c0._M_impl.super__Vector_impl_data._M_start;
            ppAVar6 = local_108._M_impl.super__Vector_impl_data._M_start, iVar5 = local_1ac,
            ppAVar4 != local_c0._M_impl.super__Vector_impl_data._M_finish; ppAVar4 = ppAVar4 + 1) {
          for (; ppAVar6 != local_108._M_impl.super__Vector_impl_data._M_finish;
              ppAVar6 = ppAVar6 + 1) {
            local_148 = 0;
            uStack_140 = 0;
            local_138 = 0;
            AtomType::getName_abi_cxx11_(&local_190,*ppAVar4);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_148,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            AtomType::getName_abi_cxx11_(&local_190,*ppAVar3);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_148,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            AtomType::getName_abi_cxx11_(&local_190,*ppAVar2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_148,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            AtomType::getName_abi_cxx11_(&local_190,*ppAVar6);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_148,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            pIVar1 = TypeContainer<OpenMD::InversionType,_4>::permutedFindSkippingFirstElement
                               (local_170,(KeyType *)&local_148,&this->wildCardAtomTypeName_);
            if (pIVar1 != (ElemPtr)0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_190,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_148);
              local_190.field_2._12_4_ = local_1a8;
              local_190.field_2._8_4_ = iVar5;
              std::
              vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ::
              emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          *)&local_168,
                         (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_190);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_148);
            iVar5 = iVar5 + 1;
          }
          local_1a8 = local_1a8 + 1;
        }
        local_1ac = local_1ac + 1;
      }
      local_1a4 = local_1a4 + 1;
      ppAVar2 = local_d8._M_impl.super__Vector_impl_data._M_finish;
    }
    if (local_168.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_190,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      pIVar1 = TypeContainer<OpenMD::InversionType,_4>::permutedFindSkippingFirstElement
                         (local_170,(KeyType *)&local_190,&this->wildCardAtomTypeName_);
      goto LAB_00152769;
    }
    pIVar1 = (ElemPtr)0x0;
  }
  else {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_190,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_168.
                super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
    pIVar1 = TypeContainer<OpenMD::InversionType,_4>::permutedFindSkippingFirstElement
                       (local_170,(KeyType *)&local_190);
LAB_00152769:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_190);
  }
  std::
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector(&local_168);
  std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
            (&local_108);
  std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
            (&local_f0);
  std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
            (&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
LAB_00152472:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return pIVar1;
}

Assistant:

InversionType* ForceField::getInversionType(const std::string& at1,
                                              const std::string& at2,
                                              const std::string& at3,
                                              const std::string& at4) {
    std::vector<std::string> keys;
    keys.push_back(at1);
    keys.push_back(at2);
    keys.push_back(at3);
    keys.push_back(at4);

    // try exact match first
    InversionType* inversionType =
        inversionTypeCont_.permutedFindSkippingFirstElement(keys);
    if (inversionType) {
      return inversionType;
    } else {
      AtomType* atype1;
      AtomType* atype2;
      AtomType* atype3;
      AtomType* atype4;
      std::vector<std::string> at1key;
      at1key.push_back(at1);
      atype1 = atomTypeCont_.find(at1key);

      std::vector<std::string> at2key;
      at2key.push_back(at2);
      atype2 = atomTypeCont_.find(at2key);

      std::vector<std::string> at3key;
      at3key.push_back(at3);
      atype3 = atomTypeCont_.find(at3key);

      std::vector<std::string> at4key;
      at4key.push_back(at4);
      atype4 = atomTypeCont_.find(at4key);

      // query atom types for their chains of responsibility
      std::vector<AtomType*> at1Chain = atype1->allYourBase();
      std::vector<AtomType*> at2Chain = atype2->allYourBase();
      std::vector<AtomType*> at3Chain = atype3->allYourBase();
      std::vector<AtomType*> at4Chain = atype4->allYourBase();

      std::vector<AtomType*>::iterator i;
      std::vector<AtomType*>::iterator j;
      std::vector<AtomType*>::iterator k;
      std::vector<AtomType*>::iterator l;

      int ii = 0;
      int jj = 0;
      int kk = 0;
      int ll = 0;
      int Iscore;
      int JKLscore;

      std::vector<std::tuple<int, int, std::vector<std::string>>>
          foundInversions;

      for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
        kk = 0;
        for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
          ii = 0;
          for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
            ll = 0;
            for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
              Iscore   = ii;
              JKLscore = jj + kk + ll;

              std::vector<std::string> myKeys;
              myKeys.push_back((*i)->getName());
              myKeys.push_back((*j)->getName());
              myKeys.push_back((*k)->getName());
              myKeys.push_back((*l)->getName());

              InversionType* inversionType =
                  inversionTypeCont_.permutedFindSkippingFirstElement(myKeys);
              if (inversionType) {
                foundInversions.push_back(
                    std::make_tuple(Iscore, JKLscore, myKeys));
              }
              ll++;
            }
            ii++;
          }
          kk++;
        }
        jj++;
      }

      if (!foundInversions.empty()) {
        std::sort(foundInversions.begin(), foundInversions.end());
        std::vector<std::string> theKeys = std::get<2>(foundInversions[0]);

        InversionType* bestType =
            inversionTypeCont_.permutedFindSkippingFirstElement(theKeys);

        return bestType;
      } else {
        // if no exact match found, try wild card match
        for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
          kk = 0;
          for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
            ii = 0;
            for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
              ll = 0;
              for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
                Iscore   = ii;
                JKLscore = jj + kk + ll;

                std::vector<std::string> myKeys;
                myKeys.push_back((*i)->getName());
                myKeys.push_back((*j)->getName());
                myKeys.push_back((*k)->getName());
                myKeys.push_back((*l)->getName());
                InversionType* inversionType =
                    inversionTypeCont_.permutedFindSkippingFirstElement(
                        myKeys, wildCardAtomTypeName_);
                if (inversionType) {
                  foundInversions.push_back(
                      std::make_tuple(Iscore, JKLscore, myKeys));
                }
                ll++;
              }
              ii++;
            }
            kk++;
          }
          jj++;
        }
        if (!foundInversions.empty()) {
          std::sort(foundInversions.begin(), foundInversions.end());
          std::vector<std::string> theKeys = std::get<2>(foundInversions[0]);
          InversionType* bestType =
              inversionTypeCont_.permutedFindSkippingFirstElement(
                  theKeys, wildCardAtomTypeName_);
          return bestType;
        } else {
          return NULL;
        }
      }
    }
  }